

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ggml-quants.c
# Opt level: O0

void quantize_row_iq3_xxs_impl(int grid_size,float *x,void *vy,int64_t n,float *quant_weights)

{
  uint32_t *puVar1;
  ggml_fp16_t gVar2;
  long lVar3;
  long lVar4;
  long lVar5;
  long in_RCX;
  ggml_fp16_t *in_RDX;
  long in_RSI;
  int in_EDI;
  long in_R8;
  float fVar6;
  int l_2;
  int ib_1;
  float id;
  float d;
  int i_15;
  int grid_index_2;
  int i_14;
  uint16_t u_2;
  int k_6;
  int k_5;
  float q_1;
  float w_1;
  int i_13;
  float sumq2_1;
  float sumqx_1;
  int i_12;
  int8_t *pg;
  uint16_t *neighbours_1;
  int grid_index_1;
  int l_1;
  int i_11;
  uint16_t u_1;
  int k_4;
  float id_2;
  int k_3;
  int n_not_ongrid;
  int k_2;
  int i_10;
  float q;
  float w;
  int i_9;
  float sumq2;
  float sumqx;
  uint16_t *neighbours;
  int grid_index;
  int i_8;
  uint16_t u;
  int l;
  int i_7;
  int k_1;
  float this_scale;
  float id_1;
  int is;
  float scale;
  float best;
  int i_6;
  float max;
  float ax;
  int i_5;
  float min;
  int imin;
  int i_4;
  uint8_t s;
  int nflip;
  int k;
  int i_3;
  int i_2;
  int i_1;
  float *qw;
  float *xb;
  int ib;
  float sigma2;
  int i;
  float sumx2;
  float *xbl;
  float max_scale;
  int ibl;
  uint8_t *qh;
  uint32_t *scales_and_signs;
  uint8_t q3 [104];
  uint8_t block_signs [8];
  _Bool is_on_grid_aux [8];
  _Bool is_on_grid [8];
  float waux [32];
  int8_t Laux [32];
  int8_t L [32];
  float xval [32];
  float weight [32];
  float scales [8];
  int quant_size;
  block_iq3_s *y_1;
  block_iq3_xxs *y;
  int block_size;
  uint8_t *qs;
  ggml_fp16_t *dh;
  int64_t nbl;
  int kMaxQ;
  uint16_t *kneighbors_q3xs;
  int *kmap_q3xs;
  uint32_t *kgrid_q3xs;
  int gindex;
  int local_450;
  int local_44c;
  int local_448;
  float local_444;
  int local_440;
  int local_43c;
  int local_438;
  float local_434;
  char local_430;
  float in_stack_fffffffffffffbd4;
  float in_stack_fffffffffffffbd8;
  float in_stack_fffffffffffffbdc;
  float in_stack_fffffffffffffbe4;
  float in_stack_fffffffffffffbe8;
  float in_stack_fffffffffffffbec;
  undefined4 in_stack_fffffffffffffbf0;
  int in_stack_fffffffffffffbf4;
  int in_stack_fffffffffffffbf8;
  undefined2 in_stack_fffffffffffffbfc;
  ushort in_stack_fffffffffffffbfe;
  int in_stack_fffffffffffffc00;
  int in_stack_fffffffffffffc04;
  int local_3f0;
  float local_3ec;
  float local_3e8;
  int local_3e4;
  int local_3cc;
  int local_3c4;
  ushort local_3be;
  int local_3bc;
  int local_3b4;
  int local_3b0;
  int local_3ac;
  int local_3a8;
  int local_39c;
  float local_398;
  float local_394;
  int iVar7;
  ushort uVar8;
  int local_378;
  int local_374;
  int local_368;
  float local_364;
  float local_360;
  int local_35c;
  float local_358;
  int local_350;
  float local_34c;
  int local_348;
  int local_344;
  byte local_33d;
  int local_33c;
  int local_338;
  int local_334;
  int local_330;
  int local_32c;
  int local_318;
  int local_310;
  float local_30c;
  float local_300;
  int local_2fc;
  undefined1 local_2e8 [64];
  uint auStack_2a8 [8];
  byte abStack_288 [8];
  byte local_280 [8];
  byte abStack_278 [8];
  byte abStack_270 [8];
  float local_268 [32];
  char local_1e8 [32];
  char local_1c8 [32];
  float local_1a8 [32];
  float afStack_128 [32];
  float afStack_a8 [9];
  int local_84;
  ggml_fp16_t *local_80;
  ggml_fp16_t *local_78;
  int local_6c;
  ggml_fp16_t *local_68;
  ggml_fp16_t *local_60;
  long local_58;
  undefined4 local_4c;
  uint16_t *local_48;
  int *local_40;
  uint32_t *local_38;
  int local_2c;
  long local_28;
  long local_20;
  ggml_fp16_t *local_18;
  long local_10;
  int local_4;
  
  local_28 = in_R8;
  local_20 = in_RCX;
  local_18 = in_RDX;
  local_10 = in_RSI;
  local_4 = in_EDI;
  local_2c = iq3_data_index(0);
  local_38 = iq3_data[local_2c].grid;
  local_40 = iq3_data[local_2c].map;
  local_48 = iq3_data[local_2c].neighbours;
  if (local_38 == (uint32_t *)0x0) {
    ggml_abort("/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]ggml/src/ggml-quants.c"
               ,0xde6,"GGML_ASSERT(%s) failed",
               "kgrid_q3xs && \"forgot to call ggml_quantize_init()?\"");
  }
  if (local_40 == (int *)0x0) {
    ggml_abort("/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]ggml/src/ggml-quants.c"
               ,0xde7,"GGML_ASSERT(%s) failed",
               "kmap_q3xs && \"forgot to call ggml_quantize_init()?\"");
  }
  if (local_48 == (uint16_t *)0x0) {
    ggml_abort("/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]ggml/src/ggml-quants.c"
               ,0xde8,"GGML_ASSERT(%s) failed",
               "kneighbors_q3xs && \"forgot to call ggml_quantize_init()?\"");
  }
  if (local_20 % 0x100 != 0) {
    ggml_abort("/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]ggml/src/ggml-quants.c"
               ,0xde9,"GGML_ASSERT(%s) failed","n%QK_K == 0");
  }
  local_4c = 8;
  local_58 = local_20 / 0x100;
  if (local_4 == 0x100) {
    local_78 = local_18;
    local_6c = 0x62;
  }
  else {
    local_80 = local_18;
    local_6c = 0x6e;
  }
  local_68 = local_18 + 1;
  local_60 = local_18;
  local_84 = local_6c + -2;
  local_2fc = 0;
  do {
    if (local_58 <= local_2fc) {
      return;
    }
    gVar2 = ggml_compute_fp32_to_fp16(in_stack_fffffffffffffbd4);
    *local_60 = gVar2;
    memset(local_2e8,0,0x68);
    local_300 = 0.0;
    lVar3 = local_10 + (long)(local_2fc << 8) * 4;
    local_30c = 0.0;
    for (local_310 = 0; local_310 < 0x100; local_310 = local_310 + 1) {
      local_30c = *(float *)(lVar3 + (long)local_310 * 4) * *(float *)(lVar3 + (long)local_310 * 4)
                  + local_30c;
    }
    for (local_318 = 0; local_318 < 8; local_318 = local_318 + 1) {
      lVar4 = lVar3 + (long)(local_318 << 5) * 4;
      if (local_28 == 0) {
        for (local_330 = 0; local_330 < 0x20; local_330 = local_330 + 1) {
          afStack_128[local_330] =
               *(float *)(lVar4 + (long)local_330 * 4) * *(float *)(lVar4 + (long)local_330 * 4);
        }
      }
      else {
        lVar5 = local_28 + (long)(local_2fc << 8) * 4;
        for (local_32c = 0; local_32c < 0x20; local_32c = local_32c + 1) {
          in_stack_fffffffffffffbdc =
               *(float *)(lVar5 + (long)(local_318 << 5) * 4 + (long)local_32c * 4);
          fVar6 = sqrtf(*(float *)(lVar4 + (long)local_32c * 4) *
                        *(float *)(lVar4 + (long)local_32c * 4) + (local_30c * 2.0) / 256.0);
          afStack_128[local_32c] = in_stack_fffffffffffffbdc * fVar6;
        }
      }
      for (local_334 = 0; local_334 < 0x20; local_334 = local_334 + 1) {
        fVar6 = sqrtf(afStack_128[local_334]);
        local_268[local_334] = fVar6;
      }
      for (local_338 = 0; local_338 < 4; local_338 = local_338 + 1) {
        local_33c = 0;
        local_33d = 0;
        for (local_344 = 0; local_344 < 8; local_344 = local_344 + 1) {
          if (*(float *)(lVar4 + (long)(local_338 * 8 + local_344) * 4) < 0.0) {
            local_1a8[local_338 * 8 + local_344] =
                 -*(float *)(lVar4 + (long)(local_338 * 8 + local_344) * 4);
            local_33c = local_33c + 1;
            local_33d = local_33d | (byte)(1 << ((byte)local_344 & 0x1f));
          }
          else {
            local_1a8[local_338 * 8 + local_344] =
                 *(float *)(lVar4 + (long)(local_338 * 8 + local_344) * 4);
          }
        }
        if (local_33c % 2 != 0) {
          local_348 = 0;
          local_34c = afStack_128[local_338 * 8] * *(float *)(lVar4 + (long)(local_338 * 8) * 4) *
                      *(float *)(lVar4 + (long)(local_338 * 8) * 4);
          for (local_350 = 1; local_350 < 8; local_350 = local_350 + 1) {
            fVar6 = afStack_128[local_338 * 8 + local_350] *
                    *(float *)(lVar4 + (long)(local_338 * 8 + local_350) * 4) *
                    *(float *)(lVar4 + (long)(local_338 * 8 + local_350) * 4);
            if (fVar6 < local_34c) {
              local_348 = local_350;
              local_34c = fVar6;
            }
          }
          local_1a8[local_338 * 8 + local_348] = -local_1a8[local_338 * 8 + local_348];
          local_33d = local_33d ^ (byte)(1 << ((byte)local_348 & 0x1f));
        }
        local_280[local_338] = local_33d & 0x7f;
      }
      local_358 = local_1a8[0];
      for (local_35c = 1; local_35c < 0x20; local_35c = local_35c + 1) {
        if (local_358 < local_1a8[local_35c] || local_358 == local_1a8[local_35c]) {
          local_358 = local_1a8[local_35c];
        }
        in_stack_fffffffffffffbd8 = local_358;
      }
      if (1e-08 <= local_358) {
        local_360 = 0.0;
        local_364 = local_358 / 15.0;
        for (local_368 = -0xf; local_368 < 0x10; local_368 = local_368 + 1) {
          for (local_374 = 0; local_374 < 8; local_374 = local_374 + 1) {
            for (local_378 = 0; local_378 < 4; local_378 = local_378 + 1) {
              local_434 = (float)nearest_int(((((float)local_368 * 0.2 + 15.0) / local_358) *
                                              local_1a8[local_374 * 4 + local_378] + -1.0) * 0.5);
              in_stack_fffffffffffffbd4 = local_434;
              if (7 < (int)local_434) {
                in_stack_fffffffffffffbd4 = 9.80909e-45;
              }
              if ((int)in_stack_fffffffffffffbd4 < 0) {
                local_430 = '\0';
              }
              else {
                if (7 < (int)local_434) {
                  local_434 = 9.80909e-45;
                }
                local_430 = SUB41(local_434,0);
              }
              local_1e8[local_374 * 4 + local_378] = local_430;
            }
            uVar8 = 0;
            for (iVar7 = 0; iVar7 < 4; iVar7 = iVar7 + 1) {
              uVar8 = uVar8 | (ushort)((int)local_1e8[local_374 * 4 + iVar7] <<
                                      ((char)iVar7 * '\x03' & 0x1fU));
            }
            iVar7 = local_40[uVar8];
            abStack_278[local_374] = 1;
            if (iVar7 < 0) {
              abStack_278[local_374] = 0;
              iq3_find_best_neighbour
                        ((uint16_t *)CONCAT44(in_stack_fffffffffffffc04,in_stack_fffffffffffffc00),
                         (uint32_t *)
                         CONCAT26(in_stack_fffffffffffffbfe,
                                  CONCAT24(in_stack_fffffffffffffbfc,in_stack_fffffffffffffbf8)),
                         (float *)CONCAT44(in_stack_fffffffffffffbf4,in_stack_fffffffffffffbf0),
                         (float *)CONCAT44(in_stack_fffffffffffffbec,in_stack_fffffffffffffbe8),
                         in_stack_fffffffffffffbe4,
                         (int8_t *)CONCAT44(in_stack_fffffffffffffbdc,in_stack_fffffffffffffbd8));
            }
          }
          local_394 = 0.0;
          local_398 = 0.0;
          for (local_39c = 0; local_39c < 0x20; local_39c = local_39c + 1) {
            fVar6 = (float)(local_1e8[local_39c] * 2 + 1);
            local_394 = afStack_128[local_39c] * local_1a8[local_39c] * fVar6 + local_394;
            local_398 = afStack_128[local_39c] * fVar6 * fVar6 + local_398;
          }
          if ((0.0 < local_398) && (local_360 * local_398 < local_394 * local_394)) {
            local_364 = local_394 / local_398;
            local_360 = local_364 * local_394;
            for (local_3a8 = 0; local_3a8 < 0x20; local_3a8 = local_3a8 + 1) {
              local_1c8[local_3a8] = local_1e8[local_3a8];
            }
            for (local_3ac = 0; local_3ac < 8; local_3ac = local_3ac + 1) {
              abStack_270[local_3ac] = abStack_278[local_3ac] & 1;
            }
          }
        }
        local_3b0 = 0;
        for (local_3b4 = 0; local_3b4 < 8; local_3b4 = local_3b4 + 1) {
          if ((abStack_270[local_3b4] & 1) == 0) {
            local_3b0 = local_3b0 + 1;
          }
        }
        if ((0 < local_3b0) && (0.0 < local_364)) {
          for (local_3bc = 0; local_3bc < 8; local_3bc = local_3bc + 1) {
            if ((abStack_270[local_3bc] & 1) == 0) {
              local_3be = 0;
              for (local_3c4 = 0; local_3c4 < 4; local_3c4 = local_3c4 + 1) {
                local_440 = nearest_int(((1.0 / local_364) * local_1a8[local_3bc * 4 + local_3c4] +
                                        -1.0) * 0.5);
                local_438 = local_440;
                if (7 < local_440) {
                  local_438 = 7;
                }
                if (local_438 < 0) {
                  local_43c = 0;
                }
                else {
                  if (7 < local_440) {
                    local_440 = 7;
                  }
                  local_43c = local_440;
                }
                local_3be = local_3be | (ushort)(local_43c << ((char)local_3c4 * '\x03' & 0x1fU));
              }
              local_3cc = local_40[local_3be];
              if (local_3cc < 0) {
                local_3cc = iq3_find_best_neighbour
                                      ((uint16_t *)
                                       CONCAT44(in_stack_fffffffffffffc04,in_stack_fffffffffffffc00)
                                       ,(uint32_t *)
                                        CONCAT26(in_stack_fffffffffffffbfe,
                                                 CONCAT24(in_stack_fffffffffffffbfc,
                                                          in_stack_fffffffffffffbf8)),
                                       (float *)CONCAT44(in_stack_fffffffffffffbf4,
                                                         in_stack_fffffffffffffbf0),
                                       (float *)CONCAT44(in_stack_fffffffffffffbec,
                                                         in_stack_fffffffffffffbe8),
                                       in_stack_fffffffffffffbe4,
                                       (int8_t *)
                                       CONCAT44(in_stack_fffffffffffffbdc,in_stack_fffffffffffffbd8)
                                      );
              }
              puVar1 = local_38;
              for (local_3e4 = 0; local_3e4 < 4; local_3e4 = local_3e4 + 1) {
                local_1c8[local_3bc * 4 + local_3e4] =
                     (char)((long)(*(char *)((long)puVar1 + (long)local_3e4 + (long)local_3cc * 4) +
                                  -1) / 2);
              }
            }
          }
          local_3e8 = 0.0;
          local_3ec = 0.0;
          for (local_3f0 = 0; local_3f0 < 0x20; local_3f0 = local_3f0 + 1) {
            fVar6 = (float)(local_1c8[local_3f0] * 2 + 1);
            local_3e8 = afStack_128[local_3f0] * local_1a8[local_3f0] * fVar6 + local_3e8;
            local_3ec = afStack_128[local_3f0] * fVar6 * fVar6 + local_3ec;
          }
          if (0.0 < local_3ec) {
            local_364 = local_3e8 / local_3ec;
          }
        }
        if (local_364 < 0.0) {
          local_364 = -local_364;
          for (in_stack_fffffffffffffc04 = 0; in_stack_fffffffffffffc04 < 4;
              in_stack_fffffffffffffc04 = in_stack_fffffffffffffc04 + 1) {
            local_280[in_stack_fffffffffffffc04] =
                 (local_280[in_stack_fffffffffffffc04] ^ 0xff) & 0x7f;
          }
        }
        for (in_stack_fffffffffffffc00 = 0; in_stack_fffffffffffffc00 < 8;
            in_stack_fffffffffffffc00 = in_stack_fffffffffffffc00 + 1) {
          in_stack_fffffffffffffbfe = 0;
          for (in_stack_fffffffffffffbf8 = 0; in_stack_fffffffffffffbf8 < 4;
              in_stack_fffffffffffffbf8 = in_stack_fffffffffffffbf8 + 1) {
            in_stack_fffffffffffffbfe =
                 in_stack_fffffffffffffbfe |
                 (ushort)((int)local_1c8[in_stack_fffffffffffffc00 * 4 + in_stack_fffffffffffffbf8]
                         << ((char)in_stack_fffffffffffffbf8 * '\x03' & 0x1fU));
          }
          in_stack_fffffffffffffbf4 = local_40[in_stack_fffffffffffffbfe];
          if (in_stack_fffffffffffffbf4 < 0) {
            printf("Oops: found point %u not on grid:",(ulong)in_stack_fffffffffffffbfe);
            for (iVar7 = 0; iVar7 < 4; iVar7 = iVar7 + 1) {
              printf(" %d",(ulong)(uint)(int)local_1c8[in_stack_fffffffffffffc00 * 4 + iVar7]);
            }
            printf("\n");
            ggml_abort("/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]ggml/src/ggml-quants.c"
                       ,0xe8a,"fatal error");
          }
          if (local_4 == 0x100) {
            local_2e8[local_318 * 8 + in_stack_fffffffffffffc00] = (char)in_stack_fffffffffffffbf4;
          }
          else {
            local_2e8[local_318 * 8 + in_stack_fffffffffffffc00] = (char)in_stack_fffffffffffffbf4;
            abStack_288[local_318] =
                 abStack_288[local_318] |
                 (byte)((in_stack_fffffffffffffbf4 >> 8) << ((byte)in_stack_fffffffffffffc00 & 0x1f)
                       );
          }
        }
        auStack_2a8[local_318] =
             (uint)local_280[0] | (uint)local_280[1] << 7 | (uint)local_280[2] << 0xe |
             (uint)local_280[3] << 0x15;
        if (local_364 < 0.0) {
          ggml_abort("/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]ggml/src/ggml-quants.c"
                     ,0xe95,"GGML_ASSERT(%s) failed","scale >= 0");
        }
        afStack_a8[local_318] = local_364;
        if (local_300 <= local_364) {
          local_444 = local_364;
        }
        else {
          local_444 = local_300;
        }
        local_300 = local_444;
      }
      else {
        afStack_a8[local_318] = 0.0;
        memset(local_1c8,0,0x20);
      }
    }
    if ((local_300 != 0.0) || (NAN(local_300))) {
      in_stack_fffffffffffffbec = local_300 / 31.0;
      gVar2 = ggml_compute_fp32_to_fp16(in_stack_fffffffffffffbd4);
      *local_60 = gVar2;
      in_stack_fffffffffffffbe8 = 1.0 / in_stack_fffffffffffffbec;
      for (in_stack_fffffffffffffbe4 = 0.0; (int)in_stack_fffffffffffffbe4 < 8;
          in_stack_fffffffffffffbe4 = (float)((int)in_stack_fffffffffffffbe4 + 1)) {
        local_450 = nearest_int((in_stack_fffffffffffffbe8 *
                                 afStack_a8[(int)in_stack_fffffffffffffbe4] + -1.0) * 0.5);
        local_448 = local_450;
        if (0xf < local_450) {
          local_448 = 0xf;
        }
        if (local_448 < 0) {
          local_44c = 0;
        }
        else {
          if (0xf < local_450) {
            local_450 = 0xf;
          }
          local_44c = local_450;
        }
        auStack_2a8[(int)in_stack_fffffffffffffbe4] =
             local_44c << 0x1c | auStack_2a8[(int)in_stack_fffffffffffffbe4];
      }
      memcpy(local_68,local_2e8,(long)local_84);
      local_60 = (ggml_fp16_t *)(((long)local_6c & 0xfffffffffffffffeU) + (long)local_60);
      local_68 = (ggml_fp16_t *)((long)local_68 + (long)local_6c);
    }
    else {
      memset(local_68,0,(long)local_84);
      local_60 = (ggml_fp16_t *)(((long)local_6c & 0xfffffffffffffffeU) + (long)local_60);
      local_68 = (ggml_fp16_t *)((long)local_68 + (long)local_6c);
    }
    local_2fc = local_2fc + 1;
  } while( true );
}

Assistant:

static void quantize_row_iq3_xxs_impl(int grid_size, const float * GGML_RESTRICT x, void * GGML_RESTRICT vy, int64_t n,
        const float * GGML_RESTRICT quant_weights) {

    const int gindex = iq3_data_index(grid_size);

    const uint32_t * kgrid_q3xs      = iq3_data[gindex].grid;
    const int      * kmap_q3xs       = iq3_data[gindex].map;
    const uint16_t * kneighbors_q3xs = iq3_data[gindex].neighbours;

    //GGML_ASSERT(quant_weights   && "missing quantization weights");
    GGML_ASSERT(kgrid_q3xs      && "forgot to call ggml_quantize_init()?");
    GGML_ASSERT(kmap_q3xs       && "forgot to call ggml_quantize_init()?");
    GGML_ASSERT(kneighbors_q3xs && "forgot to call ggml_quantize_init()?");
    GGML_ASSERT(n%QK_K == 0);

    const int kMaxQ = 8;

    const int64_t nbl = n/QK_K;

    ggml_fp16_t * dh;
    uint8_t * qs;
    int block_size;
    if (grid_size == 256) {
        block_iq3_xxs * y = vy;
        dh = &y->d;
        qs = y->qs;
        block_size = sizeof(block_iq3_xxs);
    } else {
        block_iq3_s * y = vy;
        dh = &y->d;
        qs = y->qs;
        block_size = sizeof(block_iq3_s);
    }
    int quant_size = block_size - sizeof(ggml_fp16_t);

    float scales[QK_K/32];
    float weight[32];
    float xval[32];
    int8_t L[32];
    int8_t Laux[32];
    float  waux[32];
    bool   is_on_grid[8];
    bool   is_on_grid_aux[8];
    uint8_t block_signs[8];
    uint8_t q3[3*(QK_K/8)+QK_K/32];
    uint32_t * scales_and_signs = (uint32_t *)(q3 + QK_K/4);
    uint8_t  * qh = q3 + 3*(QK_K/8);

    for (int ibl = 0; ibl < nbl; ++ibl) {

        dh[0] = GGML_FP32_TO_FP16(0.f);
        memset(q3, 0, 3*QK_K/8+QK_K/32);

        float max_scale = 0;

        const float * xbl = x + QK_K*ibl;
        float sumx2 = 0;
        for (int i = 0; i < QK_K; ++i) sumx2 += xbl[i]*xbl[i];
        float sigma2 = 2*sumx2/QK_K;

        for (int ib = 0; ib < QK_K/32; ++ib) {
            const float * xb = xbl + 32*ib;
            if (quant_weights) {
                const float * qw = quant_weights + QK_K*ibl + 32*ib;
                for (int i = 0; i < 32; ++i) weight[i] = qw[i] * sqrtf(sigma2 + xb[i]*xb[i]);
            } else {
                for (int i = 0; i < 32; ++i) weight[i] = xb[i]*xb[i];
            }
            for (int i = 0; i < 32; ++i) waux[i] = sqrtf(weight[i]);
            for (int k = 0; k < 4; ++k) {
                int nflip = 0;
                uint8_t s = 0;
                for (int i = 0; i < 8; ++i) {
                    if (xb[8*k + i] >= 0) xval[8*k + i] = xb[8*k + i];
                    else {
                        xval[8*k + i] = -xb[8*k + i]; ++nflip; s |= (1 << i);
                    }
                }
                if (nflip%2) {
                    int imin = 0; float min = weight[8*k+imin]*xb[8*k+imin]*xb[8*k+imin];
                    for (int i = 1; i < 8; ++i) {
                        float ax = weight[8*k+i]*xb[8*k+i]*xb[8*k+i];
                        if (ax < min) {
                            min = ax; imin = i;
                        }
                    }
                    xval[8*k+imin] = -xval[8*k+imin];
                    s ^= (1 << imin);
                }
                block_signs[k] = s & 127;
            }
            float max = xval[0];
            for (int i = 1; i < 32; ++i) max = MAX(max, xval[i]);
            if (max < GROUP_MAX_EPS_IQ3_XXS) {
                scales[ib] = 0;
                memset(L, 0, 32);
                continue;
            }
            float best = 0;
            float scale = max/(2*kMaxQ-1);
            for (int is = -15; is <= 15; ++is) {
                float id = (2*kMaxQ-1+is*0.2f)/max;
                float this_scale = 1/id;
                for (int k = 0; k < 8; ++k) {
                    for (int i = 0; i < 4; ++i) {
                        int l = nearest_int(0.5f*(id*xval[4*k+i]-1));
                        Laux[4*k+i] = MAX(0, MIN(kMaxQ-1, l));
                    }
                    uint16_t u = 0;
                    for (int i = 0; i < 4; ++i) u |= (Laux[4*k+i] << 3*i);
                    int grid_index = kmap_q3xs[u];
                    is_on_grid_aux[k] = true;
                    if (grid_index < 0) {
                        is_on_grid_aux[k] = false;
                        const uint16_t * neighbours = kneighbors_q3xs - kmap_q3xs[u] - 1;
                        grid_index = iq3_find_best_neighbour(neighbours, kgrid_q3xs, xval + 4*k, waux + 4*k, this_scale, Laux + 4*k);
                    }
                }
                float sumqx = 0, sumq2 = 0;
                for (int i = 0; i < 32; ++i) {
                    float w = weight[i];
                    float q = 2*Laux[i] + 1;
                    sumqx += w*xval[i]*q;
                    sumq2 += w*q*q;
                }
                if (sumq2 > 0 && sumqx*sumqx > best*sumq2) {
                    scale = sumqx/sumq2; best = scale*sumqx;
                    for (int i = 0; i < 32; ++i) L[i] = Laux[i];
                    for (int k = 0; k <  8; ++k) is_on_grid[k] = is_on_grid_aux[k];
                }
            }
            int n_not_ongrid = 0;
            for (int k = 0; k < 8; ++k) if (!is_on_grid[k]) ++n_not_ongrid;
            if (n_not_ongrid > 0 && scale > 0) {
                float id = 1/scale;
                for (int k = 0; k < 8; ++k) {
                    if (is_on_grid[k]) continue;
                    uint16_t u = 0;
                    for (int i = 0; i < 4; ++i) {
                        int l = nearest_int(0.5f*(id*xval[4*k+i]-1));
                        l = MAX(0, MIN(kMaxQ-1, l));
                        u |= (l << 3*i);
                    }
                    int grid_index = kmap_q3xs[u];
                    if (grid_index < 0) {
                        const uint16_t * neighbours = kneighbors_q3xs - kmap_q3xs[u] - 1;
                        grid_index = iq3_find_best_neighbour(neighbours, kgrid_q3xs, xval + 4*k, waux + 4*k, scale, L + 4*k);
                    }
                    const int8_t * pg = (const int8_t *)(kgrid_q3xs + grid_index);
                    for (int i = 0; i < 4; ++i) L[4*k+i] = (pg[i] - 1)/2;
                }
                float sumqx = 0, sumq2 = 0;
                for (int i = 0; i < 32; ++i) {
                    float w = weight[i];
                    float q = 2*L[i] + 1;
                    sumqx += w*xval[i]*q;
                    sumq2 += w*q*q;
                }
                if (sumq2 > 0) scale = sumqx/sumq2;
            }
            if (scale < 0) {
                // This should never happen, but just in case, flip scale so that it is positive (we use uint's to encode the scale)
                // and correspondingly flip quant signs.
                scale = -scale;
                for (int k = 0; k < 4; ++k) block_signs[k] = (~block_signs[k]) & 127;
            }
            for (int k = 0; k < 8; ++k) {
                uint16_t u = 0;
                for (int i = 0; i < 4; ++i) u |= (L[4*k+i] << 3*i);
                int grid_index = kmap_q3xs[u];
                if (grid_index < 0) {
                    printf("Oops: found point %u not on grid:", u);
                    for (int i = 0; i < 4; ++i) printf(" %d", L[4*k+i]);
                    printf("\n");
                    GGML_ABORT("fatal error");
                }
                if (grid_size == 256) {
                    q3[8*ib+k] = grid_index;
                } else {
                    q3[8*ib+k] = grid_index & 255;
                    qh[ib] |= ((grid_index >> 8) << k);
                }

            }
            scales_and_signs[ib] = block_signs[0] | (block_signs[1] << 7) | (block_signs[2] << 14) | (block_signs[3] << 21);
            GGML_ASSERT(scale >= 0);
            scales[ib] = scale;
            max_scale = MAX(max_scale, scale);
        }

        if (!max_scale) {
            memset(qs, 0, quant_size);
            dh += block_size/sizeof(ggml_fp16_t);
            qs += block_size;
            continue;
        }

        float d = max_scale/31;
        dh[0] = GGML_FP32_TO_FP16(d * 1.0125f);  // small improvement via this fudge factor
        float id = 1/d;
        for (int ib = 0; ib < QK_K/32; ++ib) {
            int l = nearest_int(0.5f*(id*scales[ib]-1));
            l = MAX(0, MIN(15, l));
            scales_and_signs[ib] |= ((uint32_t)l << 28);
        }
        memcpy(qs, q3, quant_size);

        dh += block_size/sizeof(ggml_fp16_t);
        qs += block_size;

    }
}